

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O3

void sync_worker(ecs_world_t *world)

{
  int32_t iVar1;
  int iVar2;
  
  iVar1 = ecs_vector_count(world->workers);
  (*ecs_os_api.mutex_lock_)(world->sync_mutex);
  iVar2 = world->workers_waiting + 1;
  world->workers_waiting = iVar2;
  if (iVar2 == iVar1) {
    (*ecs_os_api.cond_signal_)(world->sync_cond);
  }
  (*ecs_os_api.cond_wait_)(world->worker_cond,world->sync_mutex);
  (*ecs_os_api.mutex_unlock_)(world->sync_mutex);
  return;
}

Assistant:

static
void sync_worker(
    ecs_world_t *world)
{
    int32_t thread_count = ecs_vector_count(world->workers);

    /* Signal that thread is waiting */
    ecs_os_mutex_lock(world->sync_mutex);
    if (++ world->workers_waiting == thread_count) {
        /* Only signal main thread when all threads are waiting */
        ecs_os_cond_signal(world->sync_cond);
    }

    /* Wait until main thread signals that thread can continue */
    ecs_os_cond_wait(world->worker_cond, world->sync_mutex);
    ecs_os_mutex_unlock(world->sync_mutex);
}